

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O2

Ray * perspective_camera_ray(Ray *__return_storage_ptr__,PerspectiveCamera cam,float sx,float sy)

{
  Vec3 VVar1;
  
  VVar1.x = (sx + sx + -1.0) * cam.xscale;
  VVar1.y = (sy + sy + -1.0) * cam.yscale;
  VVar1.z = -cam.depth;
  VVar1 = normalized(VVar1);
  (__return_storage_ptr__->o).x = cam.eye.x;
  (__return_storage_ptr__->o).y = cam.eye.y;
  (__return_storage_ptr__->o).z = cam.eye.z;
  VVar1 = basis2world(VVar1,cam.basis[0],cam.basis[1],cam.basis[2]);
  __return_storage_ptr__->d = VVar1;
  return __return_storage_ptr__;
}

Assistant:

Ray perspective_camera_ray(PerspectiveCamera cam, float sx, float sy) {
    Vec3 basis_ray = normalized(
        (Vec3){ cam.xscale * (-1.0f + 2.0f * sx),
                cam.yscale * (-1.0f + 2.0f * sy),
                -cam.depth
                }
        );
    Ray r = {
        .o = cam.eye,
        .d = basis2world(
            basis_ray,
            cam.basis[0], cam.basis[1], cam.basis[2]
            )
    };
    return r;
}